

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.cpp
# Opt level: O3

bool wasm::Bits::isPowerOf2InvertibleFloat(double v)

{
  return ((ulong)v & 0xfffffffffffff) == 0 &&
         (long)ABS(v) + 0xfff0000000000000U < 0x7fc0000000000001;
}

Assistant:

bool isPowerOf2InvertibleFloat(double v) {
  // See isPowerOf2InvertibleFloat(float)
  const uint64_t MIN_POT = 0x001ULL << 52;  // 0x1p-1022
  const uint64_t MAX_POT = 0x7FDULL << 52;  // 0x1p+1022
  const uint64_t EXP_MASK = 0x7FFULL << 52; // mask only exponent
  const uint64_t SIGN_MASK = ~0ULL >> 1;    // mask everything except sign
  auto u = bit_cast<uint64_t>(v) & SIGN_MASK;
  return u >= MIN_POT && u <= MAX_POT && (u & EXP_MASK) == u;
}